

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

float __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this,int idx)

{
  int iVar1;
  undefined4 extraout_var;
  char *__nptr;
  double dVar2;
  undefined1 local_38 [8];
  stringc c;
  unsigned_long *attrvalue;
  int idx_local;
  CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this_local;
  
  iVar1 = (*(this->super_IIrrXMLReader<unsigned_long,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (this,(ulong)(uint)idx);
  c._8_8_ = CONCAT44(extraout_var,iVar1);
  if ((unsigned_long *)c._8_8_ == (unsigned_long *)0x0) {
    this_local._4_4_ = 0.0;
  }
  else {
    core::string<char>::string<unsigned_long>((string<char> *)local_38,(unsigned_long *)c._8_8_);
    __nptr = core::string<char>::c_str((string<char> *)local_38);
    dVar2 = atof(__nptr);
    this_local._4_4_ = (float)dVar2;
    core::string<char>::~string((string<char> *)local_38);
  }
  return this_local._4_4_;
}

Assistant:

float getAttributeValueAsFloat(int idx) const
	{
		const char_type* attrvalue = getAttributeValue(idx);
		if (!attrvalue)
			return 0;

		core::stringc c = attrvalue;
        return static_cast<float>(atof(c.c_str()));
		//return fast_atof(c.c_str());
	}